

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_searchpath.c
# Opt level: O2

int cmd_searchpath_opt(yl_opt *yo,char *cmdline,char ***posv,int *posc)

{
  char ***argv_p;
  int iVar1;
  int iVar2;
  long lVar3;
  undefined **ppuVar4;
  option *poVar5;
  int argc;
  int *local_a8;
  int opt_index;
  option options [3];
  
  argc = 0;
  ppuVar4 = &PTR_anon_var_dwarf_328c_0011c890;
  poVar5 = options;
  for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
    poVar5->name = *ppuVar4;
    ppuVar4 = ppuVar4 + 1;
    poVar5 = (option *)&poVar5->has_arg;
  }
  argv_p = &yo->argv;
  iVar1 = parse_cmdline(cmdline,&argc,argv_p);
  if (iVar1 == 0) {
    local_a8 = posc;
    while( true ) {
      iVar2 = getopt_long(argc,*argv_p,commands[7].optstring,options,&opt_index);
      iVar1 = _optind;
      if (iVar2 != 99) break;
      yo->searchdir_unset = '\x01';
    }
    if (iVar2 == -1) {
      *posv = *argv_p + _optind;
      *local_a8 = argc - iVar1;
      iVar1 = 0;
    }
    else if (iVar2 == 0x68) {
      cmd_searchpath_help();
      iVar1 = 1;
    }
    else {
      iVar1 = 1;
      yl_log('\x01',"Unknown option.");
    }
  }
  return iVar1;
}

Assistant:

int
cmd_searchpath_opt(struct yl_opt *yo, const char *cmdline, char ***posv, int *posc)
{
    int rc = 0, argc = 0;
    int opt, opt_index;
    struct option options[] = {
        {"clear", no_argument, NULL, 'c'},
        {"help", no_argument, NULL, 'h'},
        {NULL, 0, NULL, 0}
    };

    if ((rc = parse_cmdline(cmdline, &argc, &yo->argv))) {
        return rc;
    }

    while ((opt = getopt_long(argc, yo->argv, commands[CMD_SEARCHPATH].optstring, options, &opt_index)) != -1) {
        switch (opt) {
        case 'c':
            yo->searchdir_unset = 1;
            break;
        case 'h':
            cmd_searchpath_help();
            return 1;
        default:
            YLMSG_E("Unknown option.");
            return 1;
        }
    }

    *posv = &yo->argv[optind];
    *posc = argc - optind;

    return 0;
}